

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_nal.c
# Opt level: O2

int nal_to_rbsp(uint8_t *nal_buf,int *nal_size,uint8_t *rbsp_buf,int *rbsp_size)

{
  uint8_t uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  lVar3 = 0;
  iVar2 = 0;
  for (iVar4 = 0; iVar4 < *nal_size; iVar4 = iVar4 + 1) {
    if (iVar2 == 2) {
      if (nal_buf[iVar4] < 3) {
        return -1;
      }
      if (nal_buf[iVar4] == 3) {
        iVar2 = *nal_size + -1;
        if ((iVar4 < iVar2) && (3 < nal_buf[(long)iVar4 + 1])) {
          return -1;
        }
        if (iVar4 == iVar2) break;
        iVar4 = iVar4 + 1;
        iVar2 = 0;
      }
      else {
        iVar2 = 2;
      }
    }
    if (*rbsp_size <= lVar3) {
      return -1;
    }
    uVar1 = nal_buf[iVar4];
    rbsp_buf[lVar3] = uVar1;
    iVar2 = iVar2 + 1;
    if (uVar1 != '\0') {
      iVar2 = 0;
    }
    lVar3 = lVar3 + 1;
  }
  *nal_size = iVar4;
  *rbsp_size = (int)lVar3;
  return (int)lVar3;
}

Assistant:

int nal_to_rbsp(const uint8_t* nal_buf, int* nal_size, uint8_t* rbsp_buf, int* rbsp_size)
{
    int i;
    int j     = 0;
    int count = 0;
  
    for( i = 0; i < *nal_size; i++ )
    { 
        // in NAL unit, 0x000000, 0x000001 or 0x000002 shall not occur at any byte-aligned position
        if( ( count == 2 ) && ( nal_buf[i] < 0x03) ) 
        {
            return -1;
        }

        if( ( count == 2 ) && ( nal_buf[i] == 0x03) )
        {
            // check the 4th byte after 0x000003, except when cabac_zero_word is used, in which case the last three bytes of this NAL unit must be 0x000003
            if((i < *nal_size - 1) && (nal_buf[i+1] > 0x03))
            {
                return -1;
            }

            // if cabac_zero_word is used, the final byte of this NAL unit(0x03) is discarded, and the last two bytes of RBSP must be 0x0000
            if(i == *nal_size - 1)
            {
                break;
            }

            i++;
            count = 0;
        }

        if ( j >= *rbsp_size ) 
        {
            // error, not enough space
            return -1;
        }

        rbsp_buf[j] = nal_buf[i];
        if(nal_buf[i] == 0x00)
        {
            count++;
        }
        else
        {
            count = 0;
        }
        j++;
    }

    *nal_size = i;
    *rbsp_size = j;
    return j;
}